

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *o;
  Table *events;
  bool bVar1;
  TValue *pTVar2;
  int iVar3;
  TValue *io1;
  TValue *unaff_R13;
  TValue *io2;
  
  iVar3 = 100;
  do {
    if (t->tt_ == 0x45) {
      o = (GCObject *)(t->value_).f;
      pTVar2 = luaH_get(&o->h,key);
      if (pTVar2->tt_ == 0) {
        events = (o->h).metatable;
        if ((events == (Table *)0x0) || ((events->flags & 2) != 0)) {
          unaff_R13 = (TValue *)0x0;
        }
        else {
          unaff_R13 = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]);
        }
        bVar1 = true;
        if (unaff_R13 == (TValue *)0x0) {
          if (pTVar2 == &luaO_nilobject_) {
            pTVar2 = luaH_newkey(L,&o->h,key);
          }
          unaff_R13 = (TValue *)0x0;
          goto LAB_001114f9;
        }
      }
      else {
LAB_001114f9:
        pTVar2->value_ = val->value_;
        pTVar2->tt_ = val->tt_;
        (o->h).flags = '\0';
        if ((((val->tt_ & 0x40) != 0) && (((byte)(val->value_).f[9] & 3) != 0)) &&
           (((o->gch).marked & 4) != 0)) {
          luaC_barrierback_(L,o);
        }
        bVar1 = false;
      }
      if (bVar1) goto LAB_00111590;
      bVar1 = false;
      pTVar2 = t;
    }
    else {
      unaff_R13 = luaT_gettmbyobj(L,t,TM_NEWINDEX);
      if (unaff_R13->tt_ == 0) {
        luaG_typeerror(L,t,"index");
      }
LAB_00111590:
      bVar1 = true;
      pTVar2 = unaff_R13;
      if ((unaff_R13->tt_ & 0xfU) == 6) {
        bVar1 = false;
        callTM(L,unaff_R13,t,key,val,0);
        pTVar2 = t;
      }
    }
    if (!bVar1) {
      return;
    }
    iVar3 = iVar3 + -1;
    t = pTVar2;
    if (iVar3 == 0) {
      luaG_runerror(L,"loop in settable");
    }
  } while( true );
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = cast(TValue *, luaH_get(h, key));
      /* if previous value is not nil, there must be a previous entry
         in the table; moreover, a metamethod has no relevance */
      if (!ttisnil(oldval) ||
         /* previous value is nil; must check the metamethod */
         ((tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL &&
         /* no metamethod; is there a previous entry in the table? */
         (oldval != luaO_nilobject ||
         /* no previous entry; must create one. (The next test is
            always true; we only need the assignment.) */
         (oldval = luaH_newkey(L, h, key), 1)))) {
        /* no metamethod and (now) there is an entry with given key */
        setobj2t(L, oldval, val);  /* assign new value to that entry */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else  /* not a table; check metamethod */
      if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
        luaG_typeerror(L, t, "index");
    /* there is a metamethod */
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val, 0);
      return;
    }
    t = tm;  /* else repeat with 'tm' */
  }
  luaG_runerror(L, "loop in settable");
}